

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::core::ConfidentialTxOut::ConfidentialTxOut
          (ConfidentialTxOut *this,Script *locking_script,ConfidentialAssetId *asset,
          ConfidentialValue *confidential_value,ConfidentialNonce *nonce,ByteData *surjection_proof,
          ByteData *range_proof)

{
  Amount AVar1;
  Amount local_40;
  
  AVar1 = Amount::CreateBySatoshiAmount(0);
  local_40.amount_ = AVar1.amount_;
  local_40.ignore_check_ = AVar1.ignore_check_;
  AbstractTxOut::AbstractTxOut(&this->super_AbstractTxOut,&local_40,locking_script);
  (this->super_AbstractTxOut)._vptr_AbstractTxOut = (_func_int **)&PTR__ConfidentialTxOut_0072ebb0;
  ConfidentialAssetId::ConfidentialAssetId(&this->asset_,asset);
  ConfidentialValue::ConfidentialValue(&this->confidential_value_,confidential_value);
  ConfidentialNonce::ConfidentialNonce(&this->nonce_,nonce);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->surjection_proof_,
             &surjection_proof->data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->range_proof_,
             &range_proof->data_);
  return;
}

Assistant:

ConfidentialTxOut::ConfidentialTxOut(
    const Script &locking_script, const ConfidentialAssetId &asset,
    const ConfidentialValue &confidential_value,
    const ConfidentialNonce &nonce, const ByteData &surjection_proof,
    const ByteData &range_proof)
    : AbstractTxOut(Amount::CreateBySatoshiAmount(0), locking_script),
      asset_(asset),
      confidential_value_(confidential_value),
      nonce_(nonce),
      surjection_proof_(surjection_proof),
      range_proof_(range_proof) {
  // do nothing
}